

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

DdNode * cuddBddMakePrime(DdManager *dd,DdNode *cube,DdNode *f)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  DdNode *expanded;
  DdNode *var;
  DdNode *reg;
  DdNode *zero;
  DdNode *res;
  DdNode *e;
  DdNode *t;
  DdNode *scan;
  DdNode *f_local;
  DdNode *cube_local;
  DdManager *dd_local;
  
  pDVar2 = (DdNode *)((ulong)dd->one ^ 1);
  scan = f;
  f_local = cube;
  cube_local = &dd->sentinel;
  Cudd_Ref(cube);
  t = f_local;
  zero = cube;
  while( true ) {
    if (*(int *)((ulong)t & 0xfffffffffffffffe) == 0x7fffffff) {
      if (t == *(DdNode **)(cube_local + 1)) {
        Cudd_Deref(zero);
        dd_local = (DdManager *)zero;
      }
      else {
        Cudd_RecursiveDeref((DdManager *)cube_local,zero);
        dd_local = (DdManager *)0x0;
      }
      return &dd_local->sentinel;
    }
    n = Cudd_bddExistAbstract
                  ((DdManager *)cube_local,zero,
                   *(DdNode **)
                    (&(cube_local[8].type.kids.E)->index +
                    (ulong)*(uint *)((ulong)t & 0xfffffffffffffffe) * 2));
    if (n == (DdNode *)0x0) break;
    Cudd_Ref(n);
    iVar1 = Cudd_bddLeq((DdManager *)cube_local,n,scan);
    if (iVar1 == 0) {
      Cudd_RecursiveDeref((DdManager *)cube_local,n);
    }
    else {
      Cudd_RecursiveDeref((DdManager *)cube_local,zero);
      zero = n;
    }
    cuddGetBranches(t,&e,&res);
    if (e == pDVar2) {
      t = res;
    }
    else {
      if (res != pDVar2) {
        Cudd_RecursiveDeref((DdManager *)cube_local,zero);
        return (DdNode *)0x0;
      }
      t = e;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddBddMakePrime(
  DdManager *dd /* manager */,
  DdNode *cube /* cube to be expanded */,
  DdNode *f /* function of which the cube is to be made a prime */)
{
    DdNode *scan;
    DdNode *t, *e;
    DdNode *res = cube;
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    Cudd_Ref(res);
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        DdNode *reg = Cudd_Regular(scan);
        DdNode *var = dd->vars[reg->index];
        DdNode *expanded = Cudd_bddExistAbstract(dd,res,var);
        if (expanded == NULL) {
            return(NULL);
        }
        Cudd_Ref(expanded);
        if (Cudd_bddLeq(dd,expanded,f)) {
            Cudd_RecursiveDeref(dd,res);
            res = expanded;
        } else {
            Cudd_RecursiveDeref(dd,expanded);
        }
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            scan = e;
        } else if (e == zero) {
            scan = t;
        } else {
            Cudd_RecursiveDeref(dd,res);
            return(NULL);       /* cube is not a cube */
        }
    }

    if (scan == DD_ONE(dd)) {
        Cudd_Deref(res);
        return(res);
    } else {
        Cudd_RecursiveDeref(dd,res);
        return(NULL);
    }

}